

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_data.cpp
# Opt level: O2

void __thiscall libtorrent::dht::find_data_observer::reply(find_data_observer *this,msg *m)

{
  find_data *this_00;
  bool bVar1;
  int iVar2;
  char *s;
  dht_observer *pdVar3;
  string_view key;
  string_view key_00;
  string_view key_01;
  allocator<char> local_121;
  string local_120;
  digest32<160L> local_fc;
  bdecode_node id;
  bdecode_node token;
  bdecode_node r;
  string_view local_28;
  
  key._M_str = "r";
  key._M_len = 1;
  bdecode_node::dict_find_dict(&r,m->message,key);
  bVar1 = bdecode_node::operator_cast_to_bool(&r);
  if (!bVar1) {
    pdVar3 = observer::get_observer((observer *)this);
    (*(pdVar3->super_dht_logger)._vptr_dht_logger[1])
              (pdVar3,4,"[%u] missing response dict",
               (ulong)((this->super_traversal_observer).super_observer.m_algorithm.
                       super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_id);
    (*(this->super_traversal_observer).super_observer._vptr_observer[3])(this);
    goto LAB_00359398;
  }
  key_00._M_str = "id";
  key_00._M_len = 2;
  bdecode_node::dict_find_string(&id,&r,key_00);
  bVar1 = bdecode_node::operator_cast_to_bool(&id);
  if (bVar1) {
    iVar2 = bdecode_node::string_length(&id);
    if (iVar2 != 0x14) goto LAB_00359360;
    key_01._M_str = "token";
    key_01._M_len = 5;
    bdecode_node::dict_find_string(&token,&r,key_01);
    bVar1 = bdecode_node::operator_cast_to_bool(&token);
    if (bVar1) {
      this_00 = (find_data *)
                (this->super_traversal_observer).super_observer.m_algorithm.
                super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      s = bdecode_node::string_ptr(&id);
      digest32<160L>::digest32(&local_fc,s);
      local_28 = bdecode_node::string_value(&token);
      ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_120,&local_28,&local_121);
      find_data::got_write_token(this_00,&local_fc,&local_120);
      ::std::__cxx11::string::~string((string *)&local_120);
    }
    traversal_observer::reply(&this->super_traversal_observer,m);
    observer::done((observer *)this);
    ::std::
    _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
    ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   *)&token);
  }
  else {
LAB_00359360:
    pdVar3 = observer::get_observer((observer *)this);
    (*(pdVar3->super_dht_logger)._vptr_dht_logger[1])
              (pdVar3,4,"[%u] invalid id in response",
               (ulong)((this->super_traversal_observer).super_observer.m_algorithm.
                       super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_id);
    (*(this->super_traversal_observer).super_observer._vptr_observer[3])(this);
  }
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&id);
LAB_00359398:
  ::std::
  _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 *)&r);
  return;
}

Assistant:

void find_data_observer::reply(msg const& m)
{
	bdecode_node const r = m.message.dict_find_dict("r");
	if (!r)
	{
#ifndef TORRENT_DISABLE_LOGGING
		get_observer()->log(dht_logger::traversal, "[%u] missing response dict"
			, algorithm()->id());
#endif
		timeout();
		return;
	}

	bdecode_node const id = r.dict_find_string("id");
	if (!id || id.string_length() != 20)
	{
#ifndef TORRENT_DISABLE_LOGGING
		get_observer()->log(dht_logger::traversal, "[%u] invalid id in response"
			, algorithm()->id());
#endif
		timeout();
		return;
	}
	bdecode_node const token = r.dict_find_string("token");
	if (token)
	{
		static_cast<find_data*>(algorithm())->got_write_token(
			node_id(id.string_ptr()), std::string(token.string_value()));
	}

	traversal_observer::reply(m);
	done();
}